

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.h
# Opt level: O1

void __thiscall
Js::AutoInitLibraryCodeScope::~AutoInitLibraryCodeScope(AutoInitLibraryCodeScope *this)

{
  ScriptContext *this_00;
  
  this_00 = this->scriptContext;
  this_00->threadContext->isProfilingUserCode = this->oldIsProfilingUserCode;
  ScriptContext::SetIsDebuggerRecording(this_00,this->oldIsDebuggerRecording);
  return;
}

Assistant:

~AutoInitLibraryCodeScope()
        {
            this->scriptContext->GetThreadContext()->SetIsProfilingUserCode(this->oldIsProfilingUserCode);
            this->scriptContext->SetIsDebuggerRecording(this->oldIsDebuggerRecording);
        }